

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSeparateArgumentsCommand.cxx
# Opt level: O3

bool cmSeparateArgumentsCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *name;
  string *psVar1;
  pointer pcVar2;
  char *command;
  uint5 uVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  pointer name_00;
  bool bVar6;
  int iVar7;
  cmValue cVar8;
  pointer ppVar9;
  pointer ppVar10;
  pointer ppVar11;
  string_view str;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  string_view value_00;
  string_view value_01;
  string_view separator;
  string_view value_02;
  string value;
  string program;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  string programArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  undefined1 local_138 [16];
  undefined1 local_128 [24];
  _Any_data _Stack_110;
  undefined1 auStack_100 [16];
  _Any_data _Stack_f0;
  pointer ppStack_e0;
  pointer local_d8;
  pointer ppStack_d0;
  undefined1 local_c8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  string local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (name == psVar1) {
    local_138._0_8_ = (ActionMap *)local_128;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"must be given at least one argument.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((ActionMap *)local_138._0_8_ != (ActionMap *)local_128) {
      operator_delete((void *)local_138._0_8_,(ulong)(local_128._0_8_ + 1));
    }
    return false;
  }
  if ((long)psVar1 - (long)name == 0x20) {
    cVar8 = cmMakefile::GetDefinition(status->Makefile,name);
    if (cVar8.Value == (string *)0x0) {
      return true;
    }
    pcVar2 = ((cVar8.Value)->_M_dataplus)._M_p;
    local_138._0_8_ = (ActionMap *)local_128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_138,pcVar2,pcVar2 + (cVar8.Value)->_M_string_length);
    ppVar9 = (pointer)0x0;
    ppVar10 = ppVar9;
    if ((pointer)local_138._8_8_ != (pointer)0x0) {
      do {
        if (*(char *)(local_138._0_8_ + (long)ppVar9) == ' ') {
          *(char *)(local_138._0_8_ + (long)ppVar9) = ';';
        }
        ppVar9 = (pointer)((long)&(ppVar9->first)._M_len + 1);
        ppVar10 = (pointer)local_138._8_8_;
      } while ((pointer)local_138._8_8_ != ppVar9);
    }
    value_00._M_str = (char *)local_138._0_8_;
    value_00._M_len = (size_t)ppVar10;
    cmMakefile::AddDefinition(status->Makefile,name,value_00);
    if ((ActionMap *)local_138._0_8_ == (ActionMap *)local_128) {
      return true;
    }
    operator_delete((void *)local_138._0_8_,(ulong)(local_128._0_8_ + 1));
    return true;
  }
  if ((cmSeparateArgumentsCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar7 = __cxa_guard_acquire(&cmSeparateArgumentsCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar7 != 0)) {
    local_d8 = (pointer)0x0;
    ppStack_d0 = (pointer)0x0;
    _Stack_f0._8_8_ = (_Manager_type)0x0;
    ppStack_e0 = (pointer)0x0;
    auStack_100._8_8_ = 0;
    _Stack_f0._0_8_ = (_Manager_type)0x0;
    _Stack_110._8_8_ = (_Invoker_type)0x0;
    auStack_100._0_8_ = (void *)0x0;
    local_128._16_8_ = 0;
    _Stack_110._M_unused._M_object = (_Manager_type)0x0;
    local_128._0_8_ = (pointer)0x0;
    local_128._8_8_ = (void *)0x0;
    local_138._0_8_ = (ActionMap *)0x0;
    local_138._8_8_ = (pointer)0x0;
    name_01.super_string_view._M_str = "UNIX_COMMAND";
    name_01.super_string_view._M_len = 0xc;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_138,name_01,0);
    name_02.super_string_view._M_str = "WINDOWS_COMMAND";
    name_02.super_string_view._M_len = 0xf;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_138,name_02,1);
    name_03.super_string_view._M_str = "NATIVE_COMMAND";
    name_03.super_string_view._M_len = 0xe;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_138,name_03,2);
    name_04.super_string_view._M_str = "PROGRAM";
    name_04.super_string_view._M_len = 7;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_138,name_04,3);
    name_05.super_string_view._M_str = "SEPARATE_ARGS";
    name_05.super_string_view._M_len = 0xd;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_138,name_05,4);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&cmSeparateArgumentsCommand::parser,(ActionMap *)local_138);
    ArgumentParser::Base::~Base((Base *)local_138);
    __cxa_atexit(ArgumentParser::Base::~Base,&cmSeparateArgumentsCommand::parser,&__dso_handle);
    __cxa_guard_release(&cmSeparateArgumentsCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  local_128._0_8_ = &local_48;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 1;
  local_128._8_8_ = local_c8;
  local_c8._0_8_ = local_c8._0_8_ & 0xffffff0000000000;
  local_138._0_8_ = &cmSeparateArgumentsCommand::parser;
  local_138._8_8_ = (ActionMap *)0x0;
  local_128._16_8_ = 0;
  _Stack_110._M_unused._M_object = (_Manager_type)0x0;
  _Stack_110._8_8_ = (_Invoker_type)0x0;
  auStack_100._0_8_ = (void *)0x0;
  auStack_100._8_8_ = 0;
  _Stack_f0._0_8_ = (_Manager_type)0x0;
  _Stack_f0._8_8_ = (_Manager_type)0x0;
  ppStack_e0 = (pointer)0x0;
  local_d8 = (pointer)((ulong)local_d8 & 0xffffffffffffff00);
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_138,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_a8,0);
  if ((_Manager_type)_Stack_f0._8_8_ != (_Manager_type)0x0) {
    (*(code *)_Stack_f0._8_8_)
              ((_Any_data *)(auStack_100 + 8),(_Any_data *)(auStack_100 + 8),__destroy_functor);
  }
  name_00 = local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((local_c8._0_8_ & 1) == 0) {
    if (((uint)local_c8._0_8_ >> 8 & 1) != 0) goto LAB_002379b8;
    if (((uint5)local_c8._0_5_ >> 0x10 & 1) != 0) goto LAB_002379f0;
    local_138._0_8_ = local_128;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,
               "missing required option: \'UNIX_COMMAND\' or \'WINDOWS_COMMAND\' or \'NATIVE_COMMAND\'"
               ,"");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_00237cda;
  }
  if (((uint)local_c8._0_8_ >> 8 & 1) == 0) {
LAB_002379b8:
    if (((uint5)local_c8._0_5_ >> 0x10 & 1) != 0) goto LAB_002379bd;
LAB_002379f0:
    uVar3 = (uint5)local_c8._0_5_ >> 0x18;
    if (((local_c8._0_8_ & 0x100000000) == 0) || ((uVar3 & 1) != 0)) {
      if ((ulong)((long)local_48.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
        if (local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar6 = true;
          cmMakefile::AddDefinition(status->Makefile,name,(string_view)ZEXT816(0));
          goto LAB_00237cf2;
        }
        if ((local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0) {
          bVar6 = true;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = ((local_48.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          cmMakefile::AddDefinition(status->Makefile,name,(string_view)(auVar4 << 0x40));
          goto LAB_00237cf2;
        }
        if (((~SUB81(local_c8._0_8_,3) | SUB81(local_c8._0_8_,4)) & 1) == 0) {
          local_c8._0_8_ = local_c8 + 0x10;
          local_c8._8_8_ = (pointer)0x0;
          local_c8._16_8_ = local_c8._16_8_ & 0xffffffffffffff00;
          local_88._M_string_length = 0;
          local_88.field_2._M_local_buf[0] = '\0';
          str._M_str = ((local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          str._M_len = (local_48.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          cmTrimWhitespace_abi_cxx11_((string *)local_138,str);
          uVar5 = local_138._8_8_;
          if ((ActionMap *)local_138._0_8_ != (ActionMap *)local_128) {
            operator_delete((void *)local_138._0_8_,(ulong)(local_128._0_8_ + 1));
          }
          if ((ActionMap *)uVar5 != (ActionMap *)0x0) {
            local_a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cmsys::SystemTools::FindProgram((string *)local_138,name_00,&local_a8,false);
            std::__cxx11::string::operator=((string *)local_c8,(string *)local_138);
            if ((ActionMap *)local_138._0_8_ != (ActionMap *)local_128) {
              operator_delete((void *)local_138._0_8_,(ulong)(local_128._0_8_ + 1));
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_a8);
          }
          if ((pointer)local_c8._8_8_ == (pointer)0x0) {
            bVar6 = cmSystemTools::SplitProgramFromArgs(name_00,(string *)local_c8,&local_88);
            if ((bVar6) && (bVar6 = cmsys::SystemTools::FileExists((string *)local_c8), !bVar6)) {
              local_a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              cmsys::SystemTools::FindProgram
                        ((string *)local_138,(string *)local_c8,&local_a8,false);
              std::__cxx11::string::operator=((string *)local_c8,(string *)local_138);
              if ((ActionMap *)local_138._0_8_ != (ActionMap *)local_128) {
                operator_delete((void *)local_138._0_8_,(ulong)(local_128._0_8_ + 1));
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_a8);
            }
            if ((pointer)local_c8._8_8_ != (pointer)0x0) goto LAB_00237bc8;
            ppVar11 = (pointer)0x0;
          }
          else {
LAB_00237bc8:
            local_138._0_8_ = (ActionMap *)0x1;
            local_128[0] = 0x3b;
            local_a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
            local_a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_88._M_string_length;
            local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_88._M_dataplus._M_p;
            views._M_len = 2;
            views._M_array = (iterator)&local_a8;
            local_138._8_8_ = (ActionMap *)local_128;
            local_a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_128;
            cmCatViews_abi_cxx11_(&local_68,views);
            std::__cxx11::string::_M_append(local_c8,(ulong)local_68._M_dataplus._M_p);
            ppVar11 = (pointer)local_c8._8_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
              ppVar11 = (pointer)local_c8._8_8_;
            }
          }
          value_01._M_str = (char *)local_c8._0_8_;
          value_01._M_len = (size_t)ppVar11;
          cmMakefile::AddDefinition(status->Makefile,name,value_01);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,
                            CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                     local_88.field_2._M_local_buf[0]) + 1);
          }
          if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x10)) {
            operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
          }
        }
        else {
          local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
          local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          command = ((local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          if ((local_c8._0_8_ & 0x10001) == 0) {
            cmSystemTools::ParseWindowsCommandLine(command,&local_a8);
          }
          else {
            cmSystemTools::ParseUnixCommandLine(command,&local_a8);
          }
          if (((uVar3 & 1) != 0) &&
             (bVar6 = cmsys::SystemTools::FileExists
                                (local_a8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start), !bVar6)) {
            local_c8._0_8_ = (pointer)0x0;
            local_c8._8_8_ = (pointer)0x0;
            local_c8._16_8_ = 0;
            cmsys::SystemTools::FindProgram
                      ((string *)local_138,
                       local_a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_c8,false);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_c8);
            if ((ActionMap *)local_138._8_8_ == (ActionMap *)0x0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_erase_at_end(&local_a8,
                                local_a8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
            }
            else {
              std::__cxx11::string::_M_assign
                        ((string *)
                         local_a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((ActionMap *)local_138._0_8_ != (ActionMap *)local_128) {
              operator_delete((void *)local_138._0_8_,(ulong)(local_128._0_8_ + 1));
            }
          }
          std::
          for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmSeparateArgumentsCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__0>
                    (local_a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          separator._M_str = ";";
          separator._M_len = 1;
          cmJoin((string *)local_138,&local_a8,separator,(string_view)ZEXT816(0));
          value_02._M_str = (char *)local_138._0_8_;
          value_02._M_len = local_138._8_8_;
          cmMakefile::AddDefinition(status->Makefile,name,value_02);
          if ((ActionMap *)local_138._0_8_ != (ActionMap *)local_128) {
            operator_delete((void *)local_138._0_8_,(ulong)(local_128._0_8_ + 1));
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_a8);
        }
        bVar6 = true;
        goto LAB_00237cf2;
      }
      local_138._0_8_ = local_128;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_138,"given unexpected argument(s)","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      local_138._0_8_ = local_128;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_138,"`SEPARATE_ARGS` option requires `PROGRAM\' option","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
  }
  else {
LAB_002379bd:
    local_138._0_8_ = local_128;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,
               "\'UNIX_COMMAND\', \'WINDOWS_COMMAND\' and \'NATIVE_COMMAND\' are mutually exclusive"
               ,"");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
LAB_00237cda:
  if ((ActionMap *)local_138._0_8_ != (ActionMap *)local_128) {
    operator_delete((void *)local_138._0_8_,(ulong)(local_128._0_8_ + 1));
  }
  bVar6 = false;
LAB_00237cf2:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return bVar6;
}

Assistant:

bool cmSeparateArgumentsCommand(std::vector<std::string> const& args,
                                cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("must be given at least one argument.");
    return false;
  }

  std::string const& var = args.front();

  if (args.size() == 1) {
    // Original space-replacement version of command.
    if (cmValue def = status.GetMakefile().GetDefinition(var)) {
      std::string value = *def;
      std::replace(value.begin(), value.end(), ' ', ';');
      status.GetMakefile().AddDefinition(var, value);
    }

    return true;
  }

  struct Arguments
  {
    bool UnixCommand = false;
    bool WindowsCommand = false;
    bool NativeCommand = false;
    bool Program = false;
    bool SeparateArgs = false;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("UNIX_COMMAND"_s, &Arguments::UnixCommand)
      .Bind("WINDOWS_COMMAND"_s, &Arguments::WindowsCommand)
      .Bind("NATIVE_COMMAND"_s, &Arguments::NativeCommand)
      .Bind("PROGRAM"_s, &Arguments::Program)
      .Bind("SEPARATE_ARGS"_s, &Arguments::SeparateArgs);

  std::vector<std::string> unparsedArguments;
  Arguments arguments =
    parser.Parse(cmMakeRange(args).advance(1), &unparsedArguments);

  if (!arguments.UnixCommand && !arguments.WindowsCommand &&
      !arguments.NativeCommand) {
    status.SetError("missing required option: 'UNIX_COMMAND' or "
                    "'WINDOWS_COMMAND' or 'NATIVE_COMMAND'");
    return false;
  }
  if ((arguments.UnixCommand && arguments.WindowsCommand) ||
      (arguments.UnixCommand && arguments.NativeCommand) ||
      (arguments.WindowsCommand && arguments.NativeCommand)) {
    status.SetError("'UNIX_COMMAND', 'WINDOWS_COMMAND' and 'NATIVE_COMMAND' "
                    "are mutually exclusive");
    return false;
  }
  if (arguments.SeparateArgs && !arguments.Program) {
    status.SetError("`SEPARATE_ARGS` option requires `PROGRAM' option");
    return false;
  }

  if (unparsedArguments.size() > 1) {
    status.SetError("given unexpected argument(s)");
    return false;
  }

  if (unparsedArguments.empty()) {
    status.GetMakefile().AddDefinition(var, cm::string_view{});
    return true;
  }

  std::string& command = unparsedArguments.front();

  if (command.empty()) {
    status.GetMakefile().AddDefinition(var, command);
    return true;
  }

  if (arguments.Program && !arguments.SeparateArgs) {
    std::string program;
    std::string programArgs;

    // First assume the path to the program was specified with no
    // arguments and with no quoting or escaping for spaces.
    // Only bother doing this if there is non-whitespace.
    if (!cmTrimWhitespace(command).empty()) {
      program = cmSystemTools::FindProgram(command);
    }

    // If that failed then assume a command-line string was given
    // and split the program part from the rest of the arguments.
    if (program.empty()) {
      if (cmSystemTools::SplitProgramFromArgs(command, program, programArgs)) {
        if (!cmSystemTools::FileExists(program)) {
          program = cmSystemTools::FindProgram(program);
        }
      }
    }

    if (!program.empty()) {
      program += cmStrCat(';', programArgs);
    }

    status.GetMakefile().AddDefinition(var, program);
    return true;
  }

  // split command given
  std::vector<std::string> values;

  if (arguments.NativeCommand) {
#if defined(_WIN32)
    arguments.WindowsCommand = true;
#else
    arguments.UnixCommand = true;
#endif
  }

  if (arguments.UnixCommand) {
    cmSystemTools::ParseUnixCommandLine(command.c_str(), values);
  } else {
    cmSystemTools::ParseWindowsCommandLine(command.c_str(), values);
  }

  if (arguments.Program) {
    // check program exist
    if (!cmSystemTools::FileExists(values.front())) {
      auto result = cmSystemTools::FindProgram(values.front());
      if (result.empty()) {
        values.clear();
      } else {
        values.front() = result;
      }
    }
  }

  // preserve semicolons in arguments
  std::for_each(values.begin(), values.end(), [](std::string& value) {
    std::string::size_type pos = 0;
    while ((pos = value.find_first_of(';', pos)) != std::string::npos) {
      value.insert(pos, 1, '\\');
      pos += 2;
    }
  });
  auto value = cmJoin(values, ";");
  status.GetMakefile().AddDefinition(var, value);

  return true;
}